

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_rotatev3(matrix4 *self,vector3 *axis,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  quaternion q;
  matrix4 rotationMatrix;
  anon_union_32_3_07544b10_for_quaternion_0 local_b8;
  double local_98;
  matrix4 local_90;
  
  dVar4 = (axis->field_0).v[0];
  dVar3 = (axis->field_0).v[1];
  dVar6 = (axis->field_0).v[2];
  local_98 = angle * 0.5;
  dVar1 = sin(local_98);
  dVar2 = cos(local_98);
  dVar4 = dVar4 * dVar1;
  dVar3 = dVar3 * dVar1;
  dVar6 = dVar6 * dVar1;
  dVar1 = dVar2 * dVar2 + dVar6 * dVar6 + dVar4 * dVar4 + dVar3 * dVar3;
  local_b8.q[0] = dVar4;
  local_b8.q[1] = dVar3;
  local_b8.q[2] = dVar6;
  local_b8.q[3] = dVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar5 = -dVar1;
  if (-dVar1 <= dVar1) {
    dVar5 = dVar1;
  }
  if (1e-05 <= dVar5) {
    local_b8.q[0] = dVar4 / dVar1;
    local_b8.q[1] = dVar3 / dVar1;
    local_b8.q[2] = dVar6 / dVar1;
    local_b8.q[3] = dVar2 / dVar1;
  }
  matrix4_make_transformation_rotationq(&local_90,(quaternion *)&local_b8.field_1);
  matrix4_multiply(self,&local_90);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_rotatev3(struct matrix4 *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct matrix4 rotationMatrix;
	struct quaternion q;

	return matrix4_multiply(self,
				matrix4_make_transformation_rotationq(&rotationMatrix,
								      quaternion_set_from_axis_anglev3(&q, axis, angle)));
}